

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-pktgen.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint32_t uVar3;
  ixy_device *dev;
  pkt_buf *ppVar4;
  uint64_t uVar5;
  long lVar6;
  uint uVar7;
  int buf_id;
  long lVar8;
  ulong uVar9;
  uint32_t num_sent;
  uint uVar10;
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  pkt_buf *local_4278 [63];
  undefined8 uStack_4080;
  undefined1 auStack_4078 [8];
  device_stats stats_old;
  undefined1 auStack_70 [8];
  device_stats stats;
  uint64_t local_40;
  
  if (argc != 2) {
    uStack_4080 = 0x1049c3;
    printf("Usage: %s <pci bus id>\n",*argv);
    return 1;
  }
  lVar8 = 0;
  uStack_4080 = 0x1047e1;
  dev = ixy_init(argv[1],1,1,0);
  uStack_4080 = 0x1047f0;
  stats.tx_bytes = (size_t)memory_allocate_mempool(0x800,0);
  do {
    uStack_4080 = 0x104800;
    ppVar4 = pkt_buf_alloc((mempool *)stats.tx_bytes);
    lVar6 = 0x27;
    ppVar4->size = 0x3c;
    uVar10 = 0;
    ppVar4[1].buf_addr_phy = 0x1010060504030201;
    ppVar4[1].mempool = (mempool *)0x45000810101010;
    *(undefined8 *)&ppVar4[1].mempool_idx = 0x1140000000002e00;
    ppVar4[1].head_room[0] = '\0';
    ppVar4[1].head_room[1] = '\0';
    ppVar4[1].head_room[2] = '\n';
    ppVar4[1].head_room[3] = '\0';
    ppVar4[1].head_room[4] = '\0';
    ppVar4[1].head_room[5] = '\x01';
    ppVar4[1].head_room[6] = '\n';
    ppVar4[1].head_room[7] = '\0';
    puVar1 = (uint8_t *)((long)&ppVar4[1].mempool + 5);
    puVar1[0] = '\0';
    puVar1[1] = 'E';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '.';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uint8_t *)((long)&ppVar4[1].size + 1);
    puVar1[0] = '\0';
    puVar1[1] = '@';
    puVar1[2] = '\x11';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\n';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    ppVar4[1].head_room[5] = '\x01';
    ppVar4[1].head_room[6] = '\n';
    ppVar4[1].head_room[7] = '\0';
    ppVar4[1].head_room[8] = '\0';
    ppVar4[1].head_room[9] = '\x02';
    ppVar4[1].head_room[10] = '\0';
    ppVar4[1].head_room[0xb] = '*';
    ppVar4[1].head_room[0xc] = '\x05';
    ppVar4[1].head_room[0xd] = '9';
    ppVar4[1].head_room[0xe] = '\0';
    ppVar4[1].head_room[0xf] = '\x1a';
    ppVar4[1].head_room[0x10] = '\0';
    ppVar4[1].head_room[0x11] = '\0';
    ppVar4[1].head_room[0x12] = 'i';
    ppVar4[1].head_room[0x13] = 'x';
    ppVar4[1].head_room[0x14] = 'y';
    do {
      uVar7 = *(ushort *)(ppVar4->head_room + lVar6 * 2 + -0x18) + uVar10;
      uVar10 = (uVar7 & 0xffff) + 1;
      if (uVar7 < 0x10000) {
        uVar10 = uVar7;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x31);
    *(ushort *)ppVar4[1].head_room = ~(ushort)uVar10;
    *(pkt_buf **)(auStack_4078 + lVar8 * 8) = ppVar4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x800);
  lVar8 = 0;
  do {
    uStack_4080 = 0x104872;
    pkt_buf_free(*(pkt_buf **)(auStack_4078 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x800);
  uStack_4080 = 0x104885;
  local_40 = monotonic_time();
  uStack_4080 = 0x104895;
  stats_init((device_stats *)auStack_70,dev);
  uStack_4080 = 0x1048a4;
  stats_init((device_stats *)auStack_4078,dev);
  uVar9 = 0;
  do {
    do {
      pkt_buf_alloc_batch((mempool *)stats.tx_bytes,local_4278,0x40);
      auVar14._8_4_ = 8;
      auVar14._0_8_ = 0x800000008;
      auVar14._12_4_ = 8;
      auVar14._16_4_ = 8;
      auVar14._20_4_ = 8;
      auVar14._24_4_ = 8;
      auVar14._28_4_ = 8;
      auVar12 = vpbroadcastd_avx512vl();
      auVar12 = vpaddd_avx2(auVar12,_DAT_00108020);
      lVar8 = 0;
      do {
        auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_4278 + lVar8));
        lVar8 = lVar8 + 8;
        vpscatterqd_avx512f(ZEXT832(0x78) + auVar13._0_32_,0xffff,auVar12);
        auVar12 = vpaddd_avx2(auVar12,auVar14);
      } while (lVar8 != 0x40);
      uVar11 = 0;
      do {
        uVar3 = (*dev->tx_batch)(dev,0,local_4278 + uVar11,0x40 - (int)uVar11);
        uVar10 = (int)uVar11 + uVar3;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 0x40);
      uVar11 = uVar9 + 1;
      uVar2 = uVar9 & 0xfff;
      uVar9 = uVar11;
    } while (uVar2 != 0);
    uVar5 = monotonic_time();
    if (1000000000 < uVar5 - local_40) {
      (*dev->read_stats)(dev,(device_stats *)auStack_70);
      print_stats_diff((device_stats *)auStack_70,(device_stats *)auStack_4078,uVar5 - local_40);
      local_40 = uVar5;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 2) {
		printf("Usage: %s <pci bus id>\n", argv[0]);
		return 1;
	}

	struct ixy_device* dev = ixy_init(argv[1], 1, 1, 0);
	struct mempool* mempool = init_mempool();

	uint64_t last_stats_printed = monotonic_time();
	uint64_t counter = 0;
	struct device_stats stats_old, stats;
	stats_init(&stats, dev);
	stats_init(&stats_old, dev);
	uint32_t seq_num = 0;

	// array of bufs sent out in a batch
	struct pkt_buf* bufs[BATCH_SIZE];

	// tx loop
	while (true) {
		// we cannot immediately recycle packets, we need to allocate new packets every time
		// the old packets might still be used by the NIC: tx is async
		pkt_buf_alloc_batch(mempool, bufs, BATCH_SIZE);
		for (uint32_t i = 0; i < BATCH_SIZE; i++) {
			// packets can be modified here, make sure to update the checksum when changing the IP header
			*(uint32_t*)(bufs[i]->data + PKT_SIZE - 4) = seq_num++;
		}
		// the packets could be modified here to generate multiple flows
		ixy_tx_batch_busy_wait(dev, 0, bufs, BATCH_SIZE);

		// don't check time for every packet, this yields +10% performance :)
		if ((counter++ & 0xFFF) == 0) {
			uint64_t time = monotonic_time();
			if (time - last_stats_printed > 1000 * 1000 * 1000) {
				// every second
				ixy_read_stats(dev, &stats);
				print_stats_diff(&stats, &stats_old, time - last_stats_printed);
				stats_old = stats;
				last_stats_printed = time;
			}
		}
		// track stats
	}
}